

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::outputPostRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  undefined8 uVar13;
  ulong uVar14;
  bool bVar15;
  string k;
  string __str_5;
  string __str;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string *local_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  bitset<7UL> *local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  long local_40;
  size_t local_38;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  local_98 = __return_storage_ptr__;
  local_70 = increasing;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar11 = numOfAggs + 1;
  local_48 = paVar1;
  local_38 = numOfAggs;
  if (uVar11 < 3) {
    if (uVar11 == 0) {
      return local_98;
    }
    local_40 = stringOffset * 3;
    paVar1 = &local_b8.field_2;
    paVar2 = &local_d8.field_2;
    uVar11 = 0;
    do {
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct((ulong)local_68,(char)local_40);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_b8.field_2._M_allocated_capacity = *puVar7;
        local_b8.field_2._8_8_ = plVar5[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *puVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      uVar14 = idx->indexes[2] + uVar11;
      cVar12 = '\x01';
      if (9 < uVar14) {
        uVar10 = uVar14;
        cVar4 = '\x04';
        do {
          cVar12 = cVar4;
          if (uVar10 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_002507e9;
          }
          if (uVar10 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_002507e9;
          }
          if (uVar10 < 10000) goto LAB_002507e9;
          bVar15 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar4 = cVar12 + '\x04';
        } while (bVar15);
        cVar12 = cVar12 + '\x01';
      }
LAB_002507e9:
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar14);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        uVar13 = local_b8.field_2._M_allocated_capacity;
      }
      uVar14 = CONCAT44(uStack_84,local_88) + local_b8._M_string_length;
      if ((ulong)uVar13 < uVar14) {
        uVar10 = 0xf;
        if (local_90 != local_80) {
          uVar10 = local_80[0];
        }
        if (uVar10 < uVar14) goto LAB_00250868;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      }
      else {
LAB_00250868:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
      }
      local_f8 = &local_e8;
      puVar9 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar9) {
        local_e8 = *puVar9;
        uStack_e0 = puVar6[3];
      }
      else {
        local_e8 = *puVar9;
        local_f8 = (undefined8 *)*puVar6;
      }
      local_f0 = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_d8.field_2._M_allocated_capacity = *psVar8;
        local_d8.field_2._8_8_ = plVar5[3];
        local_d8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar8;
        local_d8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (local_68[0] != local_58) {
        operator_delete(local_68[0]);
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"WE EXPECT LOCAL IN POST REG TO BE SET!! \n",0x29);
      }
      else {
        uVar14 = (-(ulong)((uint)(local_70->super__Base_bitset<1UL>)._M_w & 1) & uVar11) +
                 idx->indexes[0];
        cVar12 = '\x01';
        if (9 < uVar14) {
          uVar10 = uVar14;
          cVar4 = '\x04';
          do {
            cVar12 = cVar4;
            if (uVar10 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_00250a29;
            }
            if (uVar10 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_00250a29;
            }
            if (uVar10 < 10000) goto LAB_00250a29;
            bVar15 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar4 = cVar12 + '\x04';
          } while (bVar15);
          cVar12 = cVar12 + '\x01';
        }
LAB_00250a29:
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_b8._M_dataplus._M_p,(uint)local_b8._M_string_length,uVar14);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2b3ae7);
        local_f8 = &local_e8;
        puVar9 = puVar6 + 2;
        if ((undefined8 *)*puVar6 == puVar9) {
          local_e8 = *puVar9;
          uStack_e0 = puVar6[3];
        }
        else {
          local_e8 = *puVar9;
          local_f8 = (undefined8 *)*puVar6;
        }
        local_f0 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d8.field_2._M_allocated_capacity = *psVar8;
          local_d8.field_2._8_8_ = puVar6[3];
          local_d8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar8;
          local_d8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_d8._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
        uVar14 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & uVar11) +
                 idx->indexes[1];
        cVar12 = '\x01';
        if (9 < uVar14) {
          uVar10 = uVar14;
          cVar4 = '\x04';
          do {
            cVar12 = cVar4;
            if (uVar10 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_00250bc7;
            }
            if (uVar10 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_00250bc7;
            }
            if (uVar10 < 10000) goto LAB_00250bc7;
            bVar15 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar4 = cVar12 + '\x04';
          } while (bVar15);
          cVar12 = cVar12 + '\x01';
        }
LAB_00250bc7:
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_b8._M_dataplus._M_p,(uint)local_b8._M_string_length,uVar14);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2b3b2c);
        puVar9 = puVar6 + 2;
        if ((undefined8 *)*puVar6 == puVar9) {
          local_e8 = *puVar9;
          uStack_e0 = puVar6[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *puVar9;
          local_f8 = (undefined8 *)*puVar6;
        }
        local_f0 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d8.field_2._M_allocated_capacity = *psVar8;
          local_d8.field_2._8_8_ = puVar6[3];
          local_d8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar8;
          local_d8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_d8._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      psVar3 = local_98;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)psVar3);
      bVar15 = uVar11 == local_38;
      uVar11 = uVar11 + 1;
      if (bVar15) {
        return local_98;
      }
    } while( true );
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)stringOffset * '\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
  paVar1 = &local_b8.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8.field_2._8_8_ = plVar5[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < uVar11) {
    uVar14 = uVar11;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (uVar14 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00250d98;
      }
      if (uVar14 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00250d98;
      }
      if (uVar14 < 10000) goto LAB_00250d98;
      bVar15 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar15);
    cVar12 = cVar12 + '\x01';
  }
LAB_00250d98:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar11);
  uVar11 = CONCAT44(uStack_84,local_88) + local_b8._M_string_length;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    uVar13 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar11) {
    uVar14 = 0xf;
    if (local_90 != local_80) {
      uVar14 = local_80[0];
    }
    if (uVar14 < uVar11) goto LAB_00250e09;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
  }
  else {
LAB_00250e09:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
  }
  local_f8 = &local_e8;
  puVar9 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar9) {
    local_e8 = *puVar9;
    uStack_e0 = puVar6[3];
  }
  else {
    local_e8 = *puVar9;
    local_f8 = (undefined8 *)*puVar6;
  }
  local_f0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  paVar2 = &local_d8.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d8.field_2._M_allocated_capacity = *psVar8;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar8;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)stringOffset * '\x03' + '\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8.field_2._8_8_ = plVar5[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar11 = idx->indexes[2];
  cVar12 = '\x01';
  if (9 < uVar11) {
    uVar14 = uVar11;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (uVar14 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00251004;
      }
      if (uVar14 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00251004;
      }
      if (uVar14 < 10000) goto LAB_00251004;
      bVar15 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar15);
    cVar12 = cVar12 + '\x01';
  }
LAB_00251004:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar11);
  uVar11 = CONCAT44(uStack_84,local_88) + local_b8._M_string_length;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    uVar13 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar11) {
    uVar14 = 0xf;
    if (local_90 != local_80) {
      uVar14 = local_80[0];
    }
    if (uVar11 <= uVar14) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      goto LAB_0025108b;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
LAB_0025108b:
  puVar9 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar9) {
    local_e8 = *puVar9;
    uStack_e0 = puVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar9;
    local_f8 = (undefined8 *)*puVar6;
  }
  local_f0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d8.field_2._M_allocated_capacity = *psVar8;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar8;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 1) != 0) {
    uVar11 = idx->indexes[0];
    cVar12 = '\x01';
    if (9 < uVar11) {
      uVar14 = uVar11;
      cVar4 = '\x04';
      do {
        cVar12 = cVar4;
        if (uVar14 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_002511f0;
        }
        if (uVar14 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_002511f0;
        }
        if (uVar14 < 10000) goto LAB_002511f0;
        bVar15 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar4 = cVar12 + '\x04';
      } while (bVar15);
      cVar12 = cVar12 + '\x01';
    }
LAB_002511f0:
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d8._M_dataplus._M_p,(uint)local_d8._M_string_length,uVar11);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 1) != 0) {
      std::__cxx11::string::append((char *)&local_d8);
    }
    std::operator+(&local_b8,"aggregateRegister[",&local_d8);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    puVar9 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar9) {
      local_e8 = *puVar9;
      uStack_e0 = puVar6[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar9;
      local_f8 = (undefined8 *)*puVar6;
    }
    local_f0 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_98,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
    uVar11 = idx->indexes[1];
    cVar12 = '\x01';
    if (9 < uVar11) {
      uVar14 = uVar11;
      cVar4 = '\x04';
      do {
        cVar12 = cVar4;
        if (uVar14 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_00251345;
        }
        if (uVar14 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_00251345;
        }
        if (uVar14 < 10000) goto LAB_00251345;
        bVar15 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar4 = cVar12 + '\x04';
      } while (bVar15);
      cVar12 = cVar12 + '\x01';
    }
LAB_00251345:
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d8._M_dataplus._M_p,(uint)local_d8._M_string_length,uVar11);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 2) != 0) {
      std::__cxx11::string::append((char *)&local_d8);
    }
    std::operator+(&local_b8,"postRegister[",&local_d8);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    puVar9 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar9) {
      local_e8 = *puVar9;
      uStack_e0 = puVar6[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar9;
      local_f8 = (undefined8 *)*puVar6;
    }
    local_f0 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_98,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  psVar3 = local_98;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)psVar3);
  return local_98;
}

Assistant:

std::string CppGenerator::outputPostRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset)
{
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";
        outString += offset(stringOffset+1)+
            "postRegister["+std::to_string(idx.indexes[2])+"+i] += ";
        
        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }
        // else
        // {
        //     ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
        //     //  exit(1);
        // }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="postRegister["+k+"]*";
        }
        
        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            outString += offset(stringOffset)+
                "postRegister["+std::to_string(idx.indexes[2]+i)+"] += ";
            
            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }
            else
            {
                ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
                // exit(1);
            }
            
            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="postRegister["+std::to_string(k)+"]*";
            }
            
            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}